

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O0

bool __thiscall NanoVM::execute(NanoVM *this,Instruction *inst)

{
  uchar uVar1;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_long uVar4;
  uint64_t *local_58;
  uint64_t *local_50;
  uint64_t *local_48;
  byte local_31;
  uint64_t *puStack_30;
  bool isDstReg;
  void *src;
  void *dst;
  Instruction *inst_local;
  NanoVM *this_local;
  
  local_31 = 0;
  if ((inst->isDstMem & 1U) == 0) {
    local_48 = (this->cpu).registers + inst->dstReg;
  }
  else {
    local_48 = (uint64_t *)((this->cpu).codeBase + (this->cpu).registers[inst->dstReg]);
  }
  if (inst->srcType == '\0') {
    if ((inst->isSrcMem & 1U) == 0) {
      local_50 = (this->cpu).registers + inst->srcReg;
    }
    else {
      local_50 = (uint64_t *)((this->cpu).codeBase + (this->cpu).registers[inst->srcReg]);
    }
    puStack_30 = local_50;
  }
  else {
    local_31 = (inst->isDstMem & 1U) - 1 & 1;
    if ((inst->isSrcMem & 1U) == 0) {
      local_58 = &inst->immediate;
    }
    else {
      local_58 = (uint64_t *)((this->cpu).codeBase + inst->immediate);
    }
    puStack_30 = local_58;
  }
  if ((((puStack_30 == &inst->immediate) || (puStack_30 == (this->cpu).registers + inst->srcReg)) ||
      (((this->cpu).codeBase <= puStack_30 &&
       (puStack_30 < (this->cpu).codeBase + (this->cpu).stackSize + (this->cpu).codeSize)))) &&
     ((local_48 == (this->cpu).registers + inst->dstReg ||
      (((this->cpu).codeBase <= local_48 &&
       (local_48 <= (this->cpu).codeBase + (this->cpu).stackSize + (this->cpu).codeSize)))))) {
    uVar1 = inst->srcSize;
    if (uVar1 == '\0') {
      if (local_31 == 0) {
        switch(inst->opcode) {
        case '\0':
          *(char *)local_48 = (char)*puStack_30;
          break;
        case '\x01':
          *(char *)local_48 = (char)*local_48 + (char)*puStack_30;
          break;
        case '\x02':
          *(char *)local_48 = (char)*local_48 - (char)*puStack_30;
          break;
        case '\x03':
          *(byte *)local_48 = (byte)*local_48 & (byte)*puStack_30;
          break;
        case '\x04':
          *(byte *)local_48 = (byte)*local_48 | (byte)*puStack_30;
          break;
        case '\x05':
          *(byte *)local_48 = (byte)*local_48 ^ (byte)*puStack_30;
          break;
        case '\x06':
          *(char *)local_48 = (char)((int)(uint)(byte)*local_48 >> ((byte)*puStack_30 & 0x1f));
          break;
        case '\a':
          *(char *)local_48 = (char)*local_48 << ((byte)*puStack_30 & 0x1f);
          break;
        default:
          return false;
        case '\n':
          *(char *)local_48 = (char)*local_48 * (char)*puStack_30;
          break;
        case '\v':
          *(char *)local_48 =
               (char)((ulong)(byte)*local_48 / (ulong)(long)(int)(uint)(byte)*puStack_30);
          break;
        case '\f':
          *(char *)local_48 =
               (char)((ulong)(byte)*local_48 % (ulong)(long)(int)(uint)(byte)*puStack_30);
          break;
        case '\r':
          if ((char)*local_48 == (char)*puStack_30) {
            (this->cpu).registers[9] = 0x80;
          }
          else if ((byte)*puStack_30 < (byte)*local_48) {
            (this->cpu).registers[9] = 0x40;
          }
          else {
            (this->cpu).registers[9] = 0x20;
          }
          break;
        case '\x0e':
          if (((this->cpu).registers[9] & 0x80) != 0) {
            (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x0f':
          if (((this->cpu).registers[9] & 0x80) == 0) {
            (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x10':
          if (((this->cpu).registers[9] & 0x40) != 0) {
            (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x11':
          if (((this->cpu).registers[9] & 0x20) != 0) {
            (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x12':
          (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x14':
          *(char *)puStack_30 = (char)*puStack_30 + '\x01';
          break;
        case '\x15':
          *(char *)puStack_30 = (char)*puStack_30 + -1;
          break;
        case '\x16':
          uVar4 = pop<unsigned_long>(this);
          (this->cpu).registers[8] = uVar4;
          return true;
        case '\x17':
          push<unsigned_long>(this,(this->cpu).registers[8] + (ulong)inst->instructionSize);
          (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x18':
          push<unsigned_char>(this,(uchar)*puStack_30);
          break;
        case '\x19':
          uVar1 = pop<unsigned_char>(this);
          *(uchar *)local_48 = uVar1;
          break;
        case '\x1b':
          printf("%lu",(ulong)(byte)*puStack_30);
          break;
        case '\x1c':
          printf("%s",puStack_30);
          break;
        case '\x1d':
          printf("%c",(ulong)(byte)*puStack_30);
        }
      }
      else {
        switch(inst->opcode) {
        case '\0':
          *local_48 = (ulong)(byte)*puStack_30;
          break;
        case '\x01':
          *local_48 = (ulong)(byte)*puStack_30 + *local_48;
          break;
        case '\x02':
          *local_48 = *local_48 - (ulong)(byte)*puStack_30;
          break;
        case '\x03':
          *local_48 = (ulong)(byte)*puStack_30 & *local_48;
          break;
        case '\x04':
          *local_48 = (ulong)(byte)*puStack_30 | *local_48;
          break;
        case '\x05':
          *local_48 = (ulong)(byte)*puStack_30 ^ *local_48;
          break;
        case '\x06':
          *local_48 = *local_48 >> ((byte)*puStack_30 & 0x3f);
          break;
        case '\a':
          *local_48 = *local_48 << ((byte)*puStack_30 & 0x3f);
          break;
        default:
          return false;
        case '\n':
          *local_48 = (ulong)(byte)*puStack_30 * *local_48;
          break;
        case '\v':
          *local_48 = *local_48 / (ulong)(byte)*puStack_30;
          break;
        case '\f':
          *local_48 = *local_48 % (ulong)(byte)*puStack_30;
          break;
        case '\r':
          if ((char)*local_48 == (char)*puStack_30) {
            (this->cpu).registers[9] = 0x80;
          }
          else if ((byte)*puStack_30 < (byte)*local_48) {
            (this->cpu).registers[9] = 0x40;
          }
          else {
            (this->cpu).registers[9] = 0x20;
          }
          break;
        case '\x0e':
          if (((this->cpu).registers[9] & 0x80) != 0) {
            (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x0f':
          if (((this->cpu).registers[9] & 0x80) == 0) {
            (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x10':
          if (((this->cpu).registers[9] & 0x40) != 0) {
            (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x11':
          if (((this->cpu).registers[9] & 0x20) != 0) {
            (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x12':
          (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x14':
          *(char *)puStack_30 = (char)*puStack_30 + '\x01';
          break;
        case '\x15':
          *(char *)puStack_30 = (char)*puStack_30 + -1;
          break;
        case '\x16':
          uVar4 = pop<unsigned_long>(this);
          (this->cpu).registers[8] = uVar4;
          return true;
        case '\x17':
          push<unsigned_long>(this,(this->cpu).registers[8] + (ulong)inst->instructionSize);
          (this->cpu).registers[8] = (long)(char)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x18':
          push<unsigned_char>(this,(uchar)*puStack_30);
          break;
        case '\x19':
          uVar1 = pop<unsigned_char>(this);
          *(uchar *)local_48 = uVar1;
          break;
        case '\x1b':
          printf("%lu",(ulong)(byte)*puStack_30);
          break;
        case '\x1c':
          printf("%s",puStack_30);
          break;
        case '\x1d':
          printf("%c",(ulong)(byte)*puStack_30);
        }
      }
    }
    else if (uVar1 == '\x01') {
      if (local_31 == 0) {
        switch(inst->opcode) {
        case '\0':
          *(short *)local_48 = (short)*puStack_30;
          break;
        case '\x01':
          *(short *)local_48 = (short)*local_48 + (short)*puStack_30;
          break;
        case '\x02':
          *(short *)local_48 = (short)*local_48 - (short)*puStack_30;
          break;
        case '\x03':
          *(ushort *)local_48 = (ushort)*local_48 & (ushort)*puStack_30;
          break;
        case '\x04':
          *(ushort *)local_48 = (ushort)*local_48 | (ushort)*puStack_30;
          break;
        case '\x05':
          *(ushort *)local_48 = (ushort)*local_48 ^ (ushort)*puStack_30;
          break;
        case '\x06':
          *(short *)local_48 =
               (short)((int)(uint)(ushort)*local_48 >> ((byte)(short)*puStack_30 & 0x1f));
          break;
        case '\a':
          *(short *)local_48 = (short)*local_48 << ((byte)(short)*puStack_30 & 0x1f);
          break;
        default:
          return false;
        case '\n':
          *(short *)local_48 = (short)*local_48 * (short)*puStack_30;
          break;
        case '\v':
          *(short *)local_48 =
               (short)((ulong)(ushort)*local_48 / (ulong)(long)(int)(uint)(ushort)*puStack_30);
          break;
        case '\f':
          *(short *)local_48 =
               (short)((ulong)(ushort)*local_48 % (ulong)(long)(int)(uint)(ushort)*puStack_30);
          break;
        case '\r':
          if ((short)*local_48 == (short)*puStack_30) {
            (this->cpu).registers[9] = 0x80;
          }
          else if ((ushort)*puStack_30 < (ushort)*local_48) {
            (this->cpu).registers[9] = 0x40;
          }
          else {
            (this->cpu).registers[9] = 0x20;
          }
          break;
        case '\x0e':
          if (((this->cpu).registers[9] & 0x80) != 0) {
            (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x0f':
          if (((this->cpu).registers[9] & 0x80) == 0) {
            (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x10':
          if (((this->cpu).registers[9] & 0x40) != 0) {
            (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x11':
          if (((this->cpu).registers[9] & 0x20) != 0) {
            (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x12':
          (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x14':
          *(short *)puStack_30 = (short)*puStack_30 + 1;
          break;
        case '\x15':
          *(short *)puStack_30 = (short)*puStack_30 + -1;
          break;
        case '\x16':
          uVar4 = pop<unsigned_long>(this);
          (this->cpu).registers[8] = uVar4;
          return true;
        case '\x17':
          push<unsigned_long>(this,(this->cpu).registers[8] + (ulong)inst->instructionSize);
          (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x18':
          push<unsigned_short>(this,(unsigned_short)*puStack_30);
          break;
        case '\x19':
          uVar2 = pop<unsigned_short>(this);
          *(unsigned_short *)local_48 = uVar2;
          break;
        case '\x1b':
          printf("%lu",(ulong)(ushort)*puStack_30);
          break;
        case '\x1c':
          printf("%s",puStack_30);
          break;
        case '\x1d':
          printf("%c",(ulong)(ushort)*puStack_30);
        }
      }
      else {
        switch(inst->opcode) {
        case '\0':
          *local_48 = (ulong)(ushort)*puStack_30;
          break;
        case '\x01':
          *local_48 = (ulong)(ushort)*puStack_30 + *local_48;
          break;
        case '\x02':
          *local_48 = *local_48 - (ulong)(ushort)*puStack_30;
          break;
        case '\x03':
          *local_48 = (ulong)(ushort)*puStack_30 & *local_48;
          break;
        case '\x04':
          *local_48 = (ulong)(ushort)*puStack_30 | *local_48;
          break;
        case '\x05':
          *local_48 = (ulong)(ushort)*puStack_30 ^ *local_48;
          break;
        case '\x06':
          *local_48 = *local_48 >> ((byte)(short)*puStack_30 & 0x3f);
          break;
        case '\a':
          *local_48 = *local_48 << ((byte)(short)*puStack_30 & 0x3f);
          break;
        default:
          return false;
        case '\n':
          *local_48 = (ulong)(ushort)*puStack_30 * *local_48;
          break;
        case '\v':
          *local_48 = *local_48 / (ulong)(ushort)*puStack_30;
          break;
        case '\f':
          *local_48 = *local_48 % (ulong)(ushort)*puStack_30;
          break;
        case '\r':
          if ((short)*local_48 == (short)*puStack_30) {
            (this->cpu).registers[9] = 0x80;
          }
          else if ((ushort)*puStack_30 < (ushort)*local_48) {
            (this->cpu).registers[9] = 0x40;
          }
          else {
            (this->cpu).registers[9] = 0x20;
          }
          break;
        case '\x0e':
          if (((this->cpu).registers[9] & 0x80) != 0) {
            (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x0f':
          if (((this->cpu).registers[9] & 0x80) == 0) {
            (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x10':
          if (((this->cpu).registers[9] & 0x40) != 0) {
            (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x11':
          if (((this->cpu).registers[9] & 0x20) != 0) {
            (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x12':
          (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x14':
          *(short *)puStack_30 = (short)*puStack_30 + 1;
          break;
        case '\x15':
          *(short *)puStack_30 = (short)*puStack_30 + -1;
          break;
        case '\x16':
          uVar4 = pop<unsigned_long>(this);
          (this->cpu).registers[8] = uVar4;
          return true;
        case '\x17':
          push<unsigned_long>(this,(this->cpu).registers[8] + (ulong)inst->instructionSize);
          (this->cpu).registers[8] = (long)(short)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x18':
          push<unsigned_short>(this,(unsigned_short)*puStack_30);
          break;
        case '\x19':
          uVar2 = pop<unsigned_short>(this);
          *(unsigned_short *)local_48 = uVar2;
          break;
        case '\x1b':
          printf("%lu",(ulong)(ushort)*puStack_30);
          break;
        case '\x1c':
          printf("%s",puStack_30);
          break;
        case '\x1d':
          printf("%c",(ulong)(ushort)*puStack_30);
        }
      }
    }
    else if (uVar1 == '\x02') {
      if (local_31 == 0) {
        switch(inst->opcode) {
        case '\0':
          *(uint *)local_48 = (uint)*puStack_30;
          break;
        case '\x01':
          *(uint *)local_48 = (uint)*puStack_30 + (uint)*local_48;
          break;
        case '\x02':
          *(uint *)local_48 = (uint)*local_48 - (uint)*puStack_30;
          break;
        case '\x03':
          *(uint *)local_48 = (uint)*puStack_30 & (uint)*local_48;
          break;
        case '\x04':
          *(uint *)local_48 = (uint)*puStack_30 | (uint)*local_48;
          break;
        case '\x05':
          *(uint *)local_48 = (uint)*puStack_30 ^ (uint)*local_48;
          break;
        case '\x06':
          *(uint *)local_48 = (uint)*local_48 >> ((byte)(uint)*puStack_30 & 0x1f);
          break;
        case '\a':
          *(uint *)local_48 = (uint)*local_48 << ((byte)(uint)*puStack_30 & 0x1f);
          break;
        default:
          return false;
        case '\n':
          *(uint *)local_48 = (uint)*puStack_30 * (uint)*local_48;
          break;
        case '\v':
          *(uint *)local_48 = (uint)*local_48 / (uint)*puStack_30;
          break;
        case '\f':
          *(uint *)local_48 = (uint)*local_48 % (uint)*puStack_30;
          break;
        case '\r':
          if ((uint)*local_48 == (uint)*puStack_30) {
            (this->cpu).registers[9] = 0x80;
          }
          else if ((uint)*puStack_30 < (uint)*local_48) {
            (this->cpu).registers[9] = 0x40;
          }
          else {
            (this->cpu).registers[9] = 0x20;
          }
          break;
        case '\x0e':
          if (((this->cpu).registers[9] & 0x80) != 0) {
            (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x0f':
          if (((this->cpu).registers[9] & 0x80) == 0) {
            (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x10':
          if (((this->cpu).registers[9] & 0x40) != 0) {
            (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x11':
          if (((this->cpu).registers[9] & 0x20) != 0) {
            (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x12':
          (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x14':
          *(uint *)puStack_30 = (uint)*puStack_30 + 1;
          break;
        case '\x15':
          *(uint *)puStack_30 = (uint)*puStack_30 - 1;
          break;
        case '\x16':
          uVar4 = pop<unsigned_long>(this);
          (this->cpu).registers[8] = uVar4;
          return true;
        case '\x17':
          push<unsigned_long>(this,(this->cpu).registers[8] + (ulong)inst->instructionSize);
          (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x18':
          push<unsigned_int>(this,(uint)*puStack_30);
          break;
        case '\x19':
          uVar3 = pop<unsigned_int>(this);
          *(uint *)local_48 = uVar3;
          break;
        case '\x1b':
          printf("%lu",(ulong)(uint)*puStack_30);
          break;
        case '\x1c':
          printf("%s",puStack_30);
          break;
        case '\x1d':
          printf("%c",(ulong)(uint)*puStack_30);
        }
      }
      else {
        switch(inst->opcode) {
        case '\0':
          *local_48 = (ulong)(uint)*puStack_30;
          break;
        case '\x01':
          *local_48 = (ulong)(uint)*puStack_30 + *local_48;
          break;
        case '\x02':
          *local_48 = *local_48 - (ulong)(uint)*puStack_30;
          break;
        case '\x03':
          *local_48 = (ulong)(uint)*puStack_30 & *local_48;
          break;
        case '\x04':
          *local_48 = (ulong)(uint)*puStack_30 | *local_48;
          break;
        case '\x05':
          *local_48 = (ulong)(uint)*puStack_30 ^ *local_48;
          break;
        case '\x06':
          *local_48 = *local_48 >> ((byte)(uint)*puStack_30 & 0x3f);
          break;
        case '\a':
          *local_48 = *local_48 << ((byte)(uint)*puStack_30 & 0x3f);
          break;
        default:
          return false;
        case '\n':
          *local_48 = (ulong)(uint)*puStack_30 * *local_48;
          break;
        case '\v':
          *local_48 = *local_48 / (ulong)(uint)*puStack_30;
          break;
        case '\f':
          *local_48 = *local_48 % (ulong)(uint)*puStack_30;
          break;
        case '\r':
          if ((uint)*local_48 == (uint)*puStack_30) {
            (this->cpu).registers[9] = 0x80;
          }
          else if ((uint)*puStack_30 < (uint)*local_48) {
            (this->cpu).registers[9] = 0x40;
          }
          else {
            (this->cpu).registers[9] = 0x20;
          }
          break;
        case '\x0e':
          if (((this->cpu).registers[9] & 0x80) != 0) {
            (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x0f':
          if (((this->cpu).registers[9] & 0x80) == 0) {
            (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x10':
          if (((this->cpu).registers[9] & 0x40) != 0) {
            (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x11':
          if (((this->cpu).registers[9] & 0x20) != 0) {
            (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
            return true;
          }
          break;
        case '\x12':
          (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x14':
          *(uint *)puStack_30 = (uint)*puStack_30 + 1;
          break;
        case '\x15':
          *(uint *)puStack_30 = (uint)*puStack_30 - 1;
          break;
        case '\x16':
          uVar4 = pop<unsigned_long>(this);
          (this->cpu).registers[8] = uVar4;
          return true;
        case '\x17':
          push<unsigned_long>(this,(this->cpu).registers[8] + (ulong)inst->instructionSize);
          (this->cpu).registers[8] = (long)(int)(uint)*puStack_30 + (this->cpu).registers[8];
          return true;
        case '\x18':
          push<unsigned_int>(this,(uint)*puStack_30);
          break;
        case '\x19':
          uVar3 = pop<unsigned_int>(this);
          *(uint *)local_48 = uVar3;
          break;
        case '\x1b':
          printf("%lu",(ulong)(uint)*puStack_30);
          break;
        case '\x1c':
          printf("%s",puStack_30);
          break;
        case '\x1d':
          printf("%c",(ulong)(uint)*puStack_30);
        }
      }
    }
    else {
      switch(inst->opcode) {
      case '\0':
        *local_48 = *puStack_30;
        break;
      case '\x01':
        *local_48 = *puStack_30 + *local_48;
        break;
      case '\x02':
        *local_48 = *local_48 - *puStack_30;
        break;
      case '\x03':
        *local_48 = *puStack_30 & *local_48;
        break;
      case '\x04':
        *local_48 = *puStack_30 | *local_48;
        break;
      case '\x05':
        *local_48 = *puStack_30 ^ *local_48;
        break;
      case '\x06':
        *local_48 = *local_48 >> ((byte)*puStack_30 & 0x3f);
        break;
      case '\a':
        *local_48 = *local_48 << ((byte)*puStack_30 & 0x3f);
        break;
      default:
        return false;
      case '\n':
        *local_48 = *puStack_30 * *local_48;
        break;
      case '\v':
        *local_48 = *local_48 / *puStack_30;
        break;
      case '\f':
        *local_48 = *local_48 % *puStack_30;
        break;
      case '\r':
        if (*local_48 == *puStack_30) {
          (this->cpu).registers[9] = 0x80;
        }
        else if (*puStack_30 < *local_48) {
          (this->cpu).registers[9] = 0x40;
        }
        else {
          (this->cpu).registers[9] = 0x20;
        }
        break;
      case '\x0e':
        if (((this->cpu).registers[9] & 0x80) != 0) {
          (this->cpu).registers[8] = *puStack_30 + (this->cpu).registers[8];
          return true;
        }
        break;
      case '\x0f':
        if (((this->cpu).registers[9] & 0x80) == 0) {
          (this->cpu).registers[8] = *puStack_30 + (this->cpu).registers[8];
          return true;
        }
        break;
      case '\x10':
        if (((this->cpu).registers[9] & 0x40) != 0) {
          (this->cpu).registers[8] = *puStack_30 + (this->cpu).registers[8];
          return true;
        }
        break;
      case '\x11':
        if (((this->cpu).registers[9] & 0x20) != 0) {
          (this->cpu).registers[8] = *puStack_30 + (this->cpu).registers[8];
          return true;
        }
        break;
      case '\x12':
        (this->cpu).registers[8] = *puStack_30 + (this->cpu).registers[8];
        return true;
      case '\x14':
        *puStack_30 = *puStack_30 + 1;
        break;
      case '\x15':
        *puStack_30 = *puStack_30 - 1;
        break;
      case '\x16':
        uVar4 = pop<unsigned_long>(this);
        (this->cpu).registers[8] = uVar4;
        return true;
      case '\x17':
        push<unsigned_long>(this,(this->cpu).registers[8] + (ulong)inst->instructionSize);
        (this->cpu).registers[8] = *puStack_30 + (this->cpu).registers[8];
        return true;
      case '\x18':
        push<unsigned_long>(this,*puStack_30);
        break;
      case '\x19':
        uVar4 = pop<unsigned_long>(this);
        *local_48 = uVar4;
        break;
      case '\x1b':
        printf("%lu",*puStack_30);
        break;
      case '\x1c':
        printf("%s",puStack_30);
        break;
      case '\x1d':
        printf("%c",*puStack_30);
      }
    }
    (this->cpu).registers[8] = (ulong)inst->instructionSize + (this->cpu).registers[8];
    return true;
  }
  this->errorFlag = ' ';
  return false;
}

Assistant:

bool NanoVM::execute(Instruction &inst) {
	// set source and destination addresses
	void *dst, *src;
	bool isDstReg = false;
	dst = (inst.isDstMem) ? reinterpret_cast<void*>(cpu.codeBase + cpu.registers[inst.dstReg]) : reinterpret_cast<void*>(&cpu.registers[inst.dstReg]);
	if (inst.srcType == DataType::Reg) {
		src = (inst.isSrcMem) ? reinterpret_cast<void*>(cpu.codeBase + cpu.registers[inst.srcReg]) : reinterpret_cast<void*>(&cpu.registers[inst.srcReg]);
	}
	else {
		isDstReg = (inst.isDstMem) ? false : true;
		src = (inst.isSrcMem) ? reinterpret_cast<void*>(cpu.codeBase + inst.immediate) : reinterpret_cast<void*>(&inst.immediate);
	}
	// Do bounds check
	if ((src != &inst.immediate && src != &cpu.registers[inst.srcReg] && (src < cpu.codeBase || src >= cpu.codeBase + cpu.codeSize + cpu.stackSize)) || (dst != &cpu.registers[inst.dstReg] && (dst < cpu.codeBase || dst > cpu.codeBase + cpu.codeSize + cpu.stackSize))) {
		// Source or destination is out side of VM memory
		errorFlag = MEMORY_ACCESS;
		return false;
	}

	#define MATHOP(INST, OP, SIZE, DSTSIZE) \
    case INST: {         \
		*reinterpret_cast<DSTSIZE*>(dst) OP *reinterpret_cast<SIZE*>(src); \
		break; \
    }

	//USIZE is unsigned and SIZE is signed type => e.g. uint8_t and int8_t 
	#define BRANCH(USIZE, SIZE, DSTSIZE) \
	switch(inst.opcode) { \
		MATHOP(Opcodes::Add, +=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mov, =, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sub, -=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Xor, ^=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::And, &=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Or, |=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sar, >>=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sal, <<=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Div, /=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mul, *=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mod, %=, USIZE, DSTSIZE) \
	case Opcodes::Printi: \
		std::printf("%" PRIu64 "", *reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Prints: \
		std::printf("%s", src); \
		break; \
	case Opcodes::Printc: \
		std::printf("%c", *reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Inc: \
		*reinterpret_cast<USIZE*>(src) += 1; \
		break; \
	case Opcodes::Dec: \
		*reinterpret_cast<USIZE*>(src) -= 1; \
		break; \
	case Opcodes::Push: \
		push(*reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Pop: \
		*reinterpret_cast<USIZE*>(dst) = pop<USIZE>(); \
		break; \
	case Opcodes::Jz: \
		if (cpu.registers[flags] & ZERO_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jnz: \
		if (!(cpu.registers[flags] & ZERO_FLAG)) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jg: \
		if (cpu.registers[flags] & GREATER_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Js: \
		if (cpu.registers[flags] & SMALLER_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jmp: \
		cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
		return true; \
	case Opcodes::Call: \
		push(cpu.registers[ip] + inst.instructionSize); \
		cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
		return true; \
	case Opcodes::Ret: \
		cpu.registers[ip] = pop<uint64_t>(); \
		return true; \
	case Opcodes::Cmp: \
		if (*reinterpret_cast<USIZE*>(dst) == *reinterpret_cast<USIZE*>(src)) \
			cpu.registers[flags] = ZERO_FLAG; \
		else if (*reinterpret_cast<USIZE*>(dst) > *reinterpret_cast<USIZE*>(src)) \
			cpu.registers[flags] = GREATER_FLAG; \
		else \
			cpu.registers[flags] = SMALLER_FLAG; \
		break; \
	default: \
		return false; \
	}


	switch (inst.srcSize) {	
	case Size::Byte: 
		if (isDstReg) {
			BRANCH(uint8_t, int8_t, uint64_t);
		}
		else {
			BRANCH(uint8_t, int8_t, uint8_t);
		}
		break; 
	case Size::Short: 
		if (isDstReg) {
			BRANCH(uint16_t, int16_t, uint64_t);
		}
		else {
			BRANCH(uint16_t, int16_t, uint16_t);
		}
		break;
	case Size::Dword: 
		if (isDstReg) {
			BRANCH(uint32_t, int32_t, uint64_t);
		}
		else {
			BRANCH(uint32_t, int32_t, uint32_t);
		}
		break;
	default:
		BRANCH(uint64_t, int64_t, uint64_t);
		break;
	} 
	cpu.registers[ip] += inst.instructionSize;
	return true;
}